

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_header.c
# Opt level: O2

int sam_hdr_update(SAM_hdr *hdr,SAM_hdr_type *type,...)

{
  undefined8 uVar1;
  size_t sVar2;
  char in_AL;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  SAM_hdr_tag *pSVar6;
  SAM_hdr_tag *pSVar7;
  char *pcVar8;
  undefined8 in_RCX;
  undefined8 *puVar9;
  undefined8 in_RDX;
  SAM_hdr *sh;
  undefined8 in_R8;
  undefined8 in_R9;
  int iVar10;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  SAM_hdr_tag *prev;
  undefined8 local_e8 [4];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  ap[0].overflow_arg_area = &stack0x00000008;
  uVar3 = 0x10;
  sh = hdr;
  local_e8[2] = in_RDX;
  local_e8[3] = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  while( true ) {
    uVar5 = (ulong)uVar3;
    if (uVar5 < 0x29) {
      puVar9 = (undefined8 *)((long)local_e8 + uVar5);
      uVar3 = uVar3 + 8;
      uVar5 = (ulong)uVar3;
    }
    else {
      puVar9 = (undefined8 *)ap[0].overflow_arg_area;
      ap[0].overflow_arg_area = (void *)((long)ap[0].overflow_arg_area + 8);
    }
    pcVar8 = (char *)*puVar9;
    if (pcVar8 == (char *)0x0) {
      return 0;
    }
    if ((uint)uVar5 < 0x29) {
      uVar3 = (uint)uVar5 + 8;
      puVar9 = (undefined8 *)((long)local_e8 + uVar5);
    }
    else {
      puVar9 = (undefined8 *)ap[0].overflow_arg_area;
      ap[0].overflow_arg_area = (void *)((long)ap[0].overflow_arg_area + 8);
    }
    uVar1 = *puVar9;
    pSVar6 = sam_hdr_find_key(sh,type,pcVar8,&prev);
    if (pSVar6 == (SAM_hdr_tag *)0x0) {
      pSVar6 = (SAM_hdr_tag *)pool_alloc(hdr->tag_pool);
      if (pSVar6 == (SAM_hdr_tag *)0x0) {
        return -1;
      }
      pSVar7 = prev;
      if (prev == (SAM_hdr_tag *)0x0) {
        pSVar7 = (SAM_hdr_tag *)&type->tag;
      }
      pSVar7->next = pSVar6;
      pSVar6->next = (SAM_hdr_tag_s *)0x0;
    }
    sVar2 = (hdr->text).l;
    iVar4 = ksprintf(&hdr->text,"%2.2s:%s",pcVar8,uVar1);
    if (iVar4 < 0) break;
    iVar10 = (int)sVar2;
    iVar4 = (int)(hdr->text).l - iVar10;
    pSVar6->len = iVar4;
    sh = (SAM_hdr *)hdr->str_pool;
    pcVar8 = string_ndup((string_alloc_t *)sh,(hdr->text).s + iVar10,(long)iVar4);
    pSVar6->str = pcVar8;
    if (pcVar8 == (char *)0x0) {
      return -1;
    }
  }
  return -1;
}

Assistant:

int sam_hdr_update(SAM_hdr *hdr, SAM_hdr_type *type, ...) {
    va_list ap;

    va_start(ap, type);
    
    for (;;) {
	char *k, *v;
	int idx;
	SAM_hdr_tag *tag, *prev;

	if (!(k = (char *)va_arg(ap, char *)))
	    break;
	v = va_arg(ap, char *);

	tag = sam_hdr_find_key(hdr, type, k, &prev);
	if (!tag) {
	    if (!(tag = pool_alloc(hdr->tag_pool)))
		return -1;
	    if (prev)
		prev->next = tag;
	    else
		type->tag = tag;

	    tag->next = NULL;
	}

	idx = ks_len(&hdr->text);
	if (ksprintf(&hdr->text, "%2.2s:%s", k, v) < 0)
	    return -1;
	tag->len = ks_len(&hdr->text) - idx;
	tag->str = string_ndup(hdr->str_pool,
			       ks_str(&hdr->text) + idx,
			       tag->len);
	if (!tag->str)
	    return -1;
    }

    va_end(ap);

    return 0;
}